

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O2

int IsNear(uint32_t a,uint32_t b,int limit)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  while( true ) {
    if (iVar1 + 8 == 0x28) {
      return 1;
    }
    iVar2 = (a >> ((byte)iVar1 & 0x1f) & 0xff) - (b >> ((byte)iVar1 & 0x1f) & 0xff);
    if (limit <= iVar2) break;
    iVar1 = iVar1 + 8;
    if (iVar2 == -limit || SBORROW4(iVar2,-limit) != iVar2 + limit < 0) {
      return 0;
    }
  }
  return 0;
}

Assistant:

static int IsNear(uint32_t a, uint32_t b, int limit) {
  int k;
  for (k = 0; k < 4; ++k) {
    const int delta =
        (int)((a >> (k * 8)) & 0xff) - (int)((b >> (k * 8)) & 0xff);
    if (delta >= limit || delta <= -limit) {
      return 0;
    }
  }
  return 1;
}